

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t __thiscall
driver::zetDebugResume(driver *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread)

{
  zet_pfnDebugResume_t pfnResume;
  ze_result_t result;
  zet_debug_session_handle_t hDebug_local;
  ze_device_thread_t thread_local;
  
  pfnResume._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c980 != (code *)0x0) {
    pfnResume._4_4_ = (*DAT_0011c980)(this,hDebug,thread._0_8_);
  }
  return pfnResume._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugResume(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread                       ///< [in] the thread to resume
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnResume = context.zetDdiTable.Debug.pfnResume;
        if( nullptr != pfnResume )
        {
            result = pfnResume( hDebug, thread );
        }
        else
        {
            // generic implementation
        }

        return result;
    }